

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::
~MatcherBase(MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *this)

{
  MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }